

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZStack<int,_10>,_10>::~TPZManVector(TPZManVector<TPZStack<int,_10>,_10> *this)

{
  ~TPZManVector(this);
  operator_delete(this,0x2f0);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}